

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  int iVar5;
  uchar *puVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  byte *pbVar10;
  byte *pbVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  undefined1 auVar15 [16];
  
  if (req_comp != img_n) {
    if (3 < req_comp - 1U) {
      pbrt::LogFatal<char_const(&)[31]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/stb/stb_image.h"
                 ,0x6a4,"Check failed: %s",(char (*) [31])"req_comp >= 1 && req_comp <= 4");
    }
    uVar14 = 0;
    puVar6 = (uchar *)stbi__malloc_mad3(req_comp,x,y,0);
    if (puVar6 == (uchar *)0x0) {
      free(data);
      data = (uchar *)0x0;
      *(char **)(in_FS_OFFSET + -0x270) = "outofmem";
    }
    else {
      auVar15[8] = 0xff;
      auVar15._0_8_ = 0xffffffffffffffff;
      auVar15[9] = 0xff;
      auVar15[10] = 0xff;
      auVar15[0xb] = 0xff;
      auVar15[0xc] = 0xff;
      auVar15[0xd] = 0xff;
      auVar15[0xe] = 0xff;
      auVar15[0xf] = 0xff;
      uVar12 = 0;
      iVar7 = x - 1;
      iVar5 = req_comp + img_n * 8;
      for (uVar13 = 0; uVar13 != (~((int)y >> 0x1f) & y); uVar13 = uVar13 + 1) {
        if (0x19 < iVar5 - 10U) {
switchD_0030122c_caseD_d:
          pbrt::LogFatal<char_const(&)[2]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/stb/stb_image.h"
                     ,0x6c1,"Check failed: %s",(char (*) [2])0x2cf1ae5);
        }
        iVar9 = (int)uVar13 * x;
        pbVar10 = puVar6 + (uint)(iVar9 * req_comp);
        pbVar11 = data + (uint)(iVar9 * img_n);
        switch(iVar5) {
        case 10:
          lVar8 = 0;
          for (iVar9 = iVar7; -1 < iVar9; iVar9 = iVar9 + -1) {
            puVar6[lVar8 * 2 + uVar14] = data[lVar8 + uVar12];
            puVar6[lVar8 * 2 + uVar14 + 1] = 0xff;
            lVar8 = lVar8 + 1;
          }
          break;
        case 0xb:
          pbVar10 = puVar6 + uVar14 + 2;
          for (iVar9 = iVar7; -1 < iVar9; iVar9 = iVar9 + -1) {
            bVar3 = *pbVar11;
            pbVar11 = pbVar11 + 1;
            *pbVar10 = bVar3;
            pbVar10[-1] = bVar3;
            pbVar10[-2] = bVar3;
            pbVar10 = pbVar10 + 3;
          }
          break;
        case 0xc:
          lVar8 = 0;
          iVar9 = iVar7;
          while (-1 < iVar9) {
            auVar4 = vpinsrb_avx(auVar15,(uint)data[lVar8 + uVar12],0);
            iVar9 = iVar9 + -1;
            auVar4 = vpshufb_avx(auVar4,SUB6416(ZEXT464(0x1000000),0));
            *(int *)(puVar6 + lVar8 * 4 + uVar14) = auVar4._0_4_;
            lVar8 = lVar8 + 1;
          }
          break;
        default:
          goto switchD_0030122c_caseD_d;
        case 0x11:
          lVar8 = 0;
          for (iVar9 = iVar7; -1 < iVar9; iVar9 = iVar9 + -1) {
            puVar6[lVar8 + uVar14] = data[lVar8 * 2 + uVar12];
            lVar8 = lVar8 + 1;
          }
          break;
        case 0x13:
          pbVar10 = puVar6 + uVar14 + 2;
          for (iVar9 = iVar7; -1 < iVar9; iVar9 = iVar9 + -1) {
            bVar3 = *pbVar11;
            pbVar11 = pbVar11 + 2;
            *pbVar10 = bVar3;
            pbVar10[-1] = bVar3;
            pbVar10[-2] = bVar3;
            pbVar10 = pbVar10 + 3;
          }
          break;
        case 0x14:
          lVar8 = 0;
          iVar9 = iVar7;
          while (-1 < iVar9) {
            iVar9 = iVar9 + -1;
            auVar4 = vpshufb_avx(ZEXT216(*(ushort *)(data + lVar8 + uVar12)),
                                 SUB6416(ZEXT464(0x1000000),0));
            *(int *)(puVar6 + lVar8 * 2 + uVar14) = auVar4._0_4_;
            lVar8 = lVar8 + 2;
          }
          break;
        case 0x19:
          for (iVar9 = iVar7; -1 < iVar9; iVar9 = iVar9 + -1) {
            bVar3 = *pbVar11;
            pbVar1 = pbVar11 + 1;
            pbVar2 = pbVar11 + 2;
            pbVar11 = pbVar11 + 3;
            *pbVar10 = (byte)((uint)*pbVar2 * 0x1d + (uint)*pbVar1 * 0x96 + (uint)bVar3 * 0x4d >> 8)
            ;
            pbVar10 = pbVar10 + 1;
          }
          break;
        case 0x1a:
          for (iVar9 = iVar7; -1 < iVar9; iVar9 = iVar9 + -1) {
            bVar3 = *pbVar11;
            pbVar1 = pbVar11 + 1;
            pbVar2 = pbVar11 + 2;
            pbVar11 = pbVar11 + 3;
            *pbVar10 = (byte)((uint)*pbVar2 * 0x1d + (uint)*pbVar1 * 0x96 + (uint)bVar3 * 0x4d >> 8)
            ;
            pbVar10[1] = 0xff;
            pbVar10 = pbVar10 + 2;
          }
          break;
        case 0x1c:
          for (iVar9 = iVar7; -1 < iVar9; iVar9 = iVar9 + -1) {
            *pbVar10 = *pbVar11;
            pbVar10[1] = pbVar11[1];
            pbVar1 = pbVar11 + 2;
            pbVar11 = pbVar11 + 3;
            pbVar10[2] = *pbVar1;
            pbVar10[3] = 0xff;
            pbVar10 = pbVar10 + 4;
          }
          break;
        case 0x21:
          lVar8 = 0;
          for (iVar9 = iVar7; -1 < iVar9; iVar9 = iVar9 + -1) {
            puVar6[lVar8 + uVar14] =
                 (uchar)((uint)data[lVar8 * 4 + uVar12 + 2] * 0x1d +
                         (uint)data[lVar8 * 4 + uVar12 + 1] * 0x96 +
                         (uint)data[lVar8 * 4 + uVar12] * 0x4d >> 8);
            lVar8 = lVar8 + 1;
          }
          break;
        case 0x22:
          lVar8 = 0;
          for (iVar9 = iVar7; -1 < iVar9; iVar9 = iVar9 + -1) {
            puVar6[lVar8 + uVar14] =
                 (uchar)((uint)data[lVar8 * 2 + uVar12 + 2] * 0x1d +
                         (uint)data[lVar8 * 2 + uVar12 + 1] * 0x96 +
                         (uint)data[lVar8 * 2 + uVar12] * 0x4d >> 8);
            puVar6[lVar8 + uVar14 + 1] = data[lVar8 * 2 + uVar12 + 3];
            lVar8 = lVar8 + 2;
          }
          break;
        case 0x23:
          for (iVar9 = iVar7; -1 < iVar9; iVar9 = iVar9 + -1) {
            *pbVar10 = *pbVar11;
            pbVar10[1] = pbVar11[1];
            pbVar1 = pbVar11 + 2;
            pbVar11 = pbVar11 + 4;
            pbVar10[2] = *pbVar1;
            pbVar10 = pbVar10 + 3;
          }
        }
        uVar12 = (ulong)((int)uVar12 + x * img_n);
        uVar14 = (ulong)((int)uVar14 + x * req_comp);
      }
      free(data);
      data = puVar6;
    }
  }
  return data;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc_mad3(req_comp, x, y, 0);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=255;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=255;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                  } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                  } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=255;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = 255;    } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                    } break;
         default: STBI_ASSERT(0); STBI_FREE(data); STBI_FREE(good); return stbi__errpuc("unsupported", "Unsupported format conversion");
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}